

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_class.c
# Opt level: O0

void class_addmethod(_class *c,t_method fn,t_symbol *sel,t_atomtype arg1,...)

{
  char in_AL;
  long lVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *local_190;
  char *local_180;
  char *local_178;
  char *local_168;
  int *local_160;
  int local_118 [8];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  uchar local_5a [8];
  uchar argvec [6];
  int i;
  int nargs;
  t_atomtype argtype;
  va_list ap;
  t_atomtype arg1_local;
  t_symbol *sel_local;
  t_method fn_local;
  _class *c_local;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  if (c == (_class *)0x0) {
    return;
  }
  ap[0]._0_8_ = &stack0x00000008;
  nargs = 0x20;
  local_f8 = in_R8;
  local_f0 = in_R9;
  if (sel == &s_signal) {
    if (c->c_floatsignalin != 0) {
      post("warning: signal method overrides class_mainsignalin");
    }
    c->c_floatsignalin = -1;
  }
  if (sel == &s_bang) {
    if (arg1 == A_NULL) {
      class_addbang(c,fn);
      return;
    }
  }
  else if (sel == &s_float) {
    if ((arg1 == A_FLOAT) && ((int)local_f8 == 0)) {
      class_doaddfloat(c,fn);
      return;
    }
  }
  else if (sel == &s_symbol) {
    if ((arg1 == A_SYMBOL) && ((int)local_f8 == 0)) {
      class_addsymbol(c,fn);
      return;
    }
  }
  else if (sel == &s_list) {
    if (arg1 == A_GIMME) {
      class_addlist(c,fn);
      return;
    }
  }
  else {
    if (sel != &s_anything) {
      argvec[2] = '\0';
      argvec[3] = '\0';
      argvec[4] = '\0';
      argvec[5] = '\0';
      i = arg1;
      while (i != 0 && (int)argvec._2_4_ < 5) {
        lVar1 = (long)(int)argvec._2_4_;
        argvec._2_4_ = argvec._2_4_ + 1;
        local_5a[lVar1] = (uchar)i;
        if ((uint)nargs < 0x29) {
          local_160 = (int *)((long)local_118 + (long)nargs);
          nargs = nargs + 8;
        }
        else {
          local_160 = (int *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        i = *local_160;
      }
      if (i != 0) {
        if (c->c_name == (t_symbol *)0x0) {
          local_168 = "<anon>";
        }
        else {
          local_168 = c->c_name->s_name;
        }
        if (sel == (t_symbol *)0x0) {
          local_178 = "<nomethod>";
        }
        else {
          local_178 = sel->s_name;
        }
        pd_error((void *)0x0,"%s_%s: only 5 arguments are typecheckable; use A_GIMME",local_168,
                 local_178);
      }
      local_5a[(int)argvec._2_4_] = '\0';
      class_addmethodtolist(c,&c->c_methods,c->c_nmethod,(t_gotfn)fn,sel,local_5a,&pd_maininstance);
      c->c_nmethod = c->c_nmethod + 1;
      return;
    }
    if (arg1 == A_GIMME) {
      class_addanything(c,fn);
      return;
    }
  }
  if (c->c_name == (t_symbol *)0x0) {
    local_180 = "<anon>";
  }
  else {
    local_180 = c->c_name->s_name;
  }
  if (sel == (t_symbol *)0x0) {
    local_190 = "<nomethod>";
  }
  else {
    local_190 = sel->s_name;
  }
  bug("class_addmethod: %s_%s: bad argument types\n",local_180,local_190);
  return;
}

Assistant:

void class_addmethod(t_class *c, t_method fn, t_symbol *sel,
    t_atomtype arg1, ...)
{
    va_list ap;
    t_atomtype argtype = arg1;
    int nargs, i;
    if(!c)
        return;
    va_start(ap, arg1);
        /* "signal" method specifies that we take audio signals but
        that we don't want automatic float to signal conversion.  This
        is obsolete; you should now use the CLASS_MAINSIGNALIN macro. */
    if (sel == &s_signal)
    {
        if (c->c_floatsignalin)
            post("warning: signal method overrides class_mainsignalin");
        c->c_floatsignalin = -1;
    }
        /* check for special cases.  "Pointer" is missing here so that
        pd_objectmaker's pointer method can be typechecked differently.  */
    if (sel == &s_bang)
    {
        if (argtype) goto phooey;
        class_addbang(c, fn);
    }
    else if (sel == &s_float)
    {
        if (argtype != A_FLOAT || va_arg(ap, t_atomtype)) goto phooey;
        class_doaddfloat(c, fn);
    }
    else if (sel == &s_symbol)
    {
        if (argtype != A_SYMBOL || va_arg(ap, t_atomtype)) goto phooey;
        class_addsymbol(c, fn);
    }
    else if (sel == &s_list)
    {
        if (argtype != A_GIMME) goto phooey;
        class_addlist(c, fn);
    }
    else if (sel == &s_anything)
    {
        if (argtype != A_GIMME) goto phooey;
        class_addanything(c, fn);
    }
    else
    {
        unsigned char argvec[MAXPDARG+1];
        nargs = 0;
        while (argtype != A_NULL && nargs < MAXPDARG)
        {
            argvec[nargs++] = argtype;
            argtype = va_arg(ap, t_atomtype);
        }
        if (argtype != A_NULL)
            pd_error(0, "%s_%s: only 5 arguments are typecheckable; use A_GIMME",
                (c->c_name)?(c->c_name->s_name):"<anon>", sel?(sel->s_name):"<nomethod>");
        argvec[nargs] = 0;
#ifdef PDINSTANCE
        for (i = 0; i < pd_ninstances; i++)
        {
            class_addmethodtolist(c, &c->c_methods[i], c->c_nmethod,
                (t_gotfn)fn, sel?dogensym(sel->s_name, 0, pd_instances[i]):0,
                    argvec, pd_instances[i]);
        }
#else
        class_addmethodtolist(c, &c->c_methods, c->c_nmethod,
            (t_gotfn)fn, sel, argvec, &pd_maininstance);
#endif
        c->c_nmethod++;
    }
    goto done;
phooey:
    bug("class_addmethod: %s_%s: bad argument types\n",
        (c->c_name)?(c->c_name->s_name):"<anon>", sel?(sel->s_name):"<nomethod>");
done:
    va_end(ap);
    return;
}